

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void HFilter8_SSE2(uint8_t *u,uint8_t *v,int stride,int thresh,int ithresh,int hev_thresh)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  __m128i *q0_00;
  long in_RDI;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uint8_t *tv;
  uint8_t *tu;
  __m128i q3;
  __m128i q2;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i p2;
  __m128i p3;
  __m128i mask;
  __m128i *in_stack_000000d0;
  int in_stack_000000d8;
  __m128i *in_stack_fffffffffffffc68;
  __m128i *in_stack_fffffffffffffc70;
  undefined4 local_388;
  int in_stack_fffffffffffffc7c;
  uint8_t *in_stack_fffffffffffffc80;
  int in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc8c;
  __m128i *in_stack_fffffffffffffc90;
  __m128i *in_stack_fffffffffffffc98;
  __m128i *in_stack_fffffffffffffca0;
  __m128i *in_stack_fffffffffffffca8;
  __m128i *in_stack_fffffffffffffcb0;
  __m128i *in_stack_fffffffffffffcb8;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_2e8;
  
  q0_00 = (__m128i *)(in_RDI + -4);
  Load16x4_SSE2((uint8_t *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,in_stack_fffffffffffffc70,
                in_stack_fffffffffffffc68,q0_00,local_2e8);
  auVar19._8_8_ = in_stack_fffffffffffffcb0;
  auVar19._0_8_ = in_stack_fffffffffffffca8;
  auVar22._8_8_ = uStack_340;
  auVar22._0_8_ = in_stack_fffffffffffffcb8;
  auVar22 = psubusb(auVar19,auVar22);
  auVar18._8_8_ = uStack_340;
  auVar18._0_8_ = in_stack_fffffffffffffcb8;
  auVar17._8_8_ = in_stack_fffffffffffffcb0;
  auVar17._0_8_ = in_stack_fffffffffffffca8;
  psubusb(auVar18,auVar17);
  auVar16._8_8_ = uStack_330;
  auVar16._0_8_ = local_338;
  auVar23._8_8_ = uStack_320;
  auVar23._0_8_ = local_328;
  auVar23 = psubusb(auVar16,auVar23);
  auVar15._8_8_ = uStack_320;
  auVar15._0_8_ = local_328;
  auVar20._8_8_ = uStack_330;
  auVar20._0_8_ = local_338;
  auVar20 = psubusb(auVar15,auVar20);
  auVar14._8_8_ = uStack_340;
  auVar14._0_8_ = in_stack_fffffffffffffcb8;
  auVar24._8_8_ = uStack_330;
  auVar24._0_8_ = local_338;
  auVar24 = psubusb(auVar14,auVar24);
  auVar13._8_8_ = uStack_330;
  auVar13._0_8_ = local_338;
  auVar12._8_8_ = uStack_340;
  auVar12._0_8_ = in_stack_fffffffffffffcb8;
  psubusb(auVar13,auVar12);
  Load16x4_SSE2((uint8_t *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,in_stack_fffffffffffffc70,
                in_stack_fffffffffffffc68,q0_00,local_2e8);
  auVar10._4_4_ = in_stack_fffffffffffffc8c;
  auVar10._0_4_ = in_stack_fffffffffffffc88;
  auVar11._8_8_ = in_stack_fffffffffffffca0;
  auVar11._0_8_ = in_stack_fffffffffffffc98;
  auVar10._8_8_ = in_stack_fffffffffffffc90;
  psubusb(auVar11,auVar10);
  auVar9._4_4_ = in_stack_fffffffffffffc8c;
  auVar9._0_4_ = in_stack_fffffffffffffc88;
  auVar9._8_8_ = in_stack_fffffffffffffc90;
  auVar21._8_8_ = in_stack_fffffffffffffca0;
  auVar21._0_8_ = in_stack_fffffffffffffc98;
  auVar21 = psubusb(auVar9,auVar21);
  auVar8._4_4_ = in_stack_fffffffffffffc7c;
  auVar8._0_4_ = local_388;
  auVar8._8_8_ = in_stack_fffffffffffffc80;
  auVar7._8_8_ = in_stack_fffffffffffffc70;
  auVar7._0_8_ = in_stack_fffffffffffffc68;
  psubusb(auVar8,auVar7);
  auVar5._4_4_ = in_stack_fffffffffffffc7c;
  auVar5._0_4_ = local_388;
  auVar6._8_8_ = in_stack_fffffffffffffc70;
  auVar6._0_8_ = in_stack_fffffffffffffc68;
  auVar5._8_8_ = in_stack_fffffffffffffc80;
  psubusb(auVar6,auVar5);
  auVar4._4_4_ = in_stack_fffffffffffffc8c;
  auVar4._0_4_ = in_stack_fffffffffffffc88;
  auVar3._4_4_ = in_stack_fffffffffffffc7c;
  auVar3._0_4_ = local_388;
  auVar4._8_8_ = in_stack_fffffffffffffc90;
  auVar3._8_8_ = in_stack_fffffffffffffc80;
  psubusb(auVar4,auVar3);
  auVar2._4_4_ = in_stack_fffffffffffffc7c;
  auVar2._0_4_ = local_388;
  auVar1._4_4_ = in_stack_fffffffffffffc8c;
  auVar1._0_4_ = in_stack_fffffffffffffc88;
  auVar2._8_8_ = in_stack_fffffffffffffc80;
  auVar1._8_8_ = in_stack_fffffffffffffc90;
  psubusb(auVar2,auVar1);
  ComplexMask_SSE2(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                   in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88,
                   auVar21._8_8_);
  DoFilter6_SSE2(auVar23._8_8_,auVar23._0_8_,auVar20._8_8_,auVar20._0_8_,auVar24._8_8_,auVar24._0_8_
                 ,in_stack_000000d0,in_stack_000000d8);
  Store16x4_SSE2(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                 in_stack_fffffffffffffca0,(uint8_t *)in_stack_fffffffffffffc98,
                 (uint8_t *)in_stack_fffffffffffffc90,auVar22._8_4_);
  Store16x4_SSE2(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                 in_stack_fffffffffffffca0,(uint8_t *)in_stack_fffffffffffffc98,
                 (uint8_t *)in_stack_fffffffffffffc90,auVar22._8_4_);
  return;
}

Assistant:

static void HFilter8_SSE2(uint8_t* u, uint8_t* v, int stride,
                          int thresh, int ithresh, int hev_thresh) {
  __m128i mask;
  __m128i p3, p2, p1, p0, q0, q1, q2, q3;

  uint8_t* const tu = u - 4;
  uint8_t* const tv = v - 4;
  Load16x4_SSE2(tu, tv, stride, &p3, &p2, &p1, &p0);
  MAX_DIFF1(p3, p2, p1, p0, mask);

  Load16x4_SSE2(u, v, stride, &q0, &q1, &q2, &q3);
  MAX_DIFF2(q3, q2, q1, q0, mask);

  ComplexMask_SSE2(&p1, &p0, &q0, &q1, thresh, ithresh, &mask);
  DoFilter6_SSE2(&p2, &p1, &p0, &q0, &q1, &q2, &mask, hev_thresh);

  Store16x4_SSE2(&p3, &p2, &p1, &p0, tu, tv, stride);
  Store16x4_SSE2(&q0, &q1, &q2, &q3, u, v, stride);
}